

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O3

void put_demapped_gray(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  JDIMENSION JVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  tga_dest_ptr dest;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *__ptr;
  long lVar4;
  
  __ptr = dinfo[1].start_output;
  JVar1 = cinfo->output_width;
  if (JVar1 != 0) {
    pJVar2 = *cinfo->colormap;
    pJVar3 = *dinfo->buffer;
    lVar4 = 0;
    do {
      __ptr[lVar4] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar2[pJVar3[lVar4]];
      lVar4 = lVar4 + 1;
    } while (JVar1 != (JDIMENSION)lVar4);
    __ptr = dinfo[1].start_output;
  }
  fwrite(__ptr,1,(ulong)*(uint *)&dinfo[1].put_pixel_rows,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_demapped_gray(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                  JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
  register JSAMPROW color_map = cinfo->colormap[0];
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    PUTPPMSAMPLE(bufferptr, color_map[*ptr++]);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}